

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QList<QRect> *
QMdi::MinOverlapPlacer::findMaxOverlappers
          (QList<QRect> *__return_storage_ptr__,QRect *domain,QList<QRect> *source)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QRect *srcRect;
  QRect *args;
  undefined1 auVar4 [16];
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QRect>::reserve(__return_storage_ptr__,(source->d).size);
  lVar3 = (source->d).size;
  if (lVar3 != 0) {
    args = (source->d).ptr;
    lVar3 = lVar3 << 4;
    iVar1 = -1;
    do {
      auVar4 = QRect::operator&(domain,args);
      iVar2 = ((auVar4._12_4_ - auVar4._4_4_) + 1) * ((auVar4._8_4_ - auVar4._0_4_) + 1);
      if (iVar1 == -1 || iVar1 <= iVar2) {
        if (iVar1 < iVar2) {
          QList<QRect>::clear(__return_storage_ptr__);
          iVar1 = iVar2;
        }
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
                  ((QMovableArrayOps<QRect> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,args);
        QList<QRect>::end(__return_storage_ptr__);
      }
      args = args + 1;
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> MinOverlapPlacer::findMaxOverlappers(const QRect &domain, const QList<QRect> &source)
{
    QList<QRect> result;
    result.reserve(source.size());

    int maxOverlap = -1;
    for (const QRect &srcRect : source) {
        QRect intersection = domain.intersected(srcRect);
        const int overlap = intersection.width() * intersection.height();
        if (overlap >= maxOverlap || maxOverlap == -1) {
            if (overlap > maxOverlap) {
                maxOverlap = overlap;
                result.clear();
            }
            result << srcRect;
        }
    }

    return result;
}